

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlParserInputBufferPtr xmlParserInputBufferCreateStatic(char *mem,int size,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr pxVar1;
  xmlBufPtr pxVar2;
  xmlCharEncodingHandlerPtr pxVar3;
  int *piVar4;
  
  if (mem != (char *)0x0 && -1 < size) {
    pxVar1 = (xmlParserInputBufferPtr)(*xmlMalloc)(0x40);
    if (pxVar1 == (xmlParserInputBufferPtr)0x0) {
      __xmlSimpleError(8,2,(xmlNodePtr)0x0,(char *)0x0,"creating input buffer");
      return (xmlParserInputBufferPtr)0x0;
    }
    pxVar1->compressed = 0;
    pxVar1->error = 0;
    pxVar1->rawconsumed = 0;
    pxVar1->buffer = (xmlBufPtr)0x0;
    pxVar1->raw = (xmlBufPtr)0x0;
    pxVar1->closecallback = (xmlInputCloseCallback)0x0;
    pxVar1->encoder = (xmlCharEncodingHandlerPtr)0x0;
    pxVar1->context = (void *)0x0;
    pxVar1->readcallback = (xmlInputReadCallback)0x0;
    pxVar2 = xmlBufCreateStatic(mem,(ulong)(uint)size);
    pxVar1->buffer = pxVar2;
    if (pxVar2 != (xmlBufPtr)0x0) {
      pxVar3 = xmlGetCharEncodingHandler(enc);
      pxVar1->encoder = pxVar3;
      if (pxVar3 == (xmlCharEncodingHandlerPtr)0x0) {
        pxVar2 = (xmlBufPtr)0x0;
      }
      else {
        piVar4 = __xmlDefaultBufferSize();
        pxVar2 = xmlBufCreateSize((long)*piVar4 * 2);
      }
      pxVar1->raw = pxVar2;
      pxVar1->compressed = -1;
      pxVar1->context = mem;
      pxVar1->readcallback = (xmlInputReadCallback)0x0;
      pxVar1->closecallback = (xmlInputCloseCallback)0x0;
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateStatic(const char *mem, int size,
                                 xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (size < 0) return(NULL);
    if (mem == NULL) return(NULL);

    ret = (xmlParserInputBufferPtr) xmlMalloc(sizeof(xmlParserInputBuffer));
    if (ret == NULL) {
	xmlIOErrMemory("creating input buffer");
	return(NULL);
    }
    memset(ret, 0, (size_t) sizeof(xmlParserInputBuffer));
    ret->buffer = xmlBufCreateStatic((void *)mem, (size_t) size);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    ret->encoder = xmlGetCharEncodingHandler(enc);
    if (ret->encoder != NULL)
        ret->raw = xmlBufCreateSize(2 * xmlDefaultBufferSize);
    else
        ret->raw = NULL;
    ret->compressed = -1;
    ret->context = (void *) mem;
    ret->readcallback = NULL;
    ret->closecallback = NULL;

    return(ret);
}